

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O0

buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> *
__thiscall
burst::
make_buffered_chunk_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,int>
          (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
           *__return_storage_ptr__,burst *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *range,
          int n)

{
  int in_R8D;
  undefined1 local_40 [16];
  undefined1 local_30 [28];
  int n_local;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *range_local;
  
  local_30._20_4_ = SUB84(range,0);
  unique0x10000063 = this;
  range_local = (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)
                __return_storage_ptr__;
  std::begin<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>
            ((iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)
             local_30);
  std::end<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>
            ((iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)
             local_40);
  make_buffered_chunk_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,int>
            (__return_storage_ptr__,(burst *)local_30,
             (istream_iterator<int,_char,_std::char_traits<char>,_long> *)local_40,
             (istream_iterator<int,_char,_std::char_traits<char>,_long> *)
             (ulong)(uint)local_30._20_4_,in_R8D);
  return __return_storage_ptr__;
}

Assistant:

auto make_buffered_chunk_iterator (const Range & range, Integral n)
    {
        using std::begin;
        using std::end;
        return make_buffered_chunk_iterator(begin(range), end(range), n);
    }